

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O3

int eia608_to_utf8(uint16_t c,int *chan,char *str1,char *str2)

{
  uint uVar1;
  int iVar2;
  char *src;
  char *src_00;
  uint uVar3;
  
  *chan = 0;
  uVar3 = (uint)c;
  if ((c & 0x6000) == 0) {
    *chan = uVar3 & 0x800;
    uVar1 = uVar3 & 0x177f;
    if ((uVar3 & 6000) == 0x1130) {
      uVar1 = uVar1 - 0x10d0;
    }
    else if ((uVar3 & 0x1760) == 0x1220) {
      uVar1 = uVar1 - 0x11b0;
    }
    else {
      if ((uVar3 & 0x1760) != 0x1320) {
        src_00 = "";
        utf8_char_copy(str1,"");
        iVar2 = 0;
        goto LAB_0010565a;
      }
      uVar1 = uVar1 - 0x1290;
    }
LAB_00105612:
    iVar2 = 1;
    uVar3 = 0xffffffff;
  }
  else {
    uVar1 = (c >> 8 & 0x7f) - 0x20;
    if ((ushort)(uVar3 & 0x7f) < 0x20) goto LAB_00105612;
    uVar3 = (uVar3 & 0x7f) - 0x20;
    iVar2 = 2;
  }
  src_00 = "";
  src = "";
  if (uVar1 < 0xb0) {
    src = eia608_char_map[uVar1];
  }
  utf8_char_copy(str1,src);
  if (uVar3 < 0xb0) {
    src_00 = eia608_char_map[uVar3];
  }
LAB_0010565a:
  utf8_char_copy(str2,src_00);
  return iVar2;
}

Assistant:

int eia608_to_utf8(uint16_t c, int* chan, char* str1, char* str2)
{
    int c1, c2;
    int size = (int)eia608_to_index(c, chan, &c1, &c2);
    utf8_char_copy(str1, utf8_from_index(c1));
    utf8_char_copy(str2, utf8_from_index(c2));
    return size;
}